

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O3

size_t __thiscall vox::nSHP::getSize(nSHP *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  sVar1 = DICT::getSize(&this->nodeAttribs);
  sVar1 = sVar1 + 8;
  if (0 < this->numModels) {
    lVar4 = 8;
    lVar3 = 0;
    do {
      sVar2 = DICT::getSize((DICT *)((long)&((this->models).
                                             super__Vector_base<vox::MODEL,_std::allocator<vox::MODEL>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->modelId +
                                    lVar4));
      sVar1 = sVar1 + sVar2 + 4;
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar3 < this->numModels);
  }
  return sVar1;
}

Assistant:

size_t nSHP::getSize() {
    size_t s = sizeof(int32_t) * 2 + nodeAttribs.getSize();
    for (int i = 0; i < numModels; i++)
        s += models[i].getSize();
    return s;
}